

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O0

CAmount wallet::TxGetChange(CWallet *wallet,CTransaction *tx)

{
  bool bVar1;
  reference __a;
  CAmount CVar2;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_FS_OFFSET;
  CTxOut *txout;
  vector<CTxOut,_std::allocator<CTxOut>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  CAmount nChange;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff28;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_stack_ffffffffffffff30;
  undefined8 uVar3;
  __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
  *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 in_stack_ffffffffffffff4b;
  int in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  CWallet *in_stack_ffffffffffffff60;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff68;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_71 [2];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffff28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff68,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff60,
             (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,(bool)in_stack_ffffffffffffff4b);
  local_71[0].field_2._1_8_ = 0;
  __s = (char *)((long)&in_RSI->field_2 + 8);
  local_71[0]._9_8_ = std::vector<CTxOut,_std::allocator<CTxOut>_>::begin(in_stack_ffffffffffffff30)
  ;
  local_71[0]._1_8_ = std::vector<CTxOut,_std::allocator<CTxOut>_>::end(in_stack_ffffffffffffff30);
  do {
    bVar1 = __gnu_cxx::operator==<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                      (in_stack_ffffffffffffff38,
                       (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                        *)in_stack_ffffffffffffff30);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      uVar3 = local_71[0].field_2._1_8_;
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff28);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return uVar3;
      }
LAB_00394fb8:
      __stack_chk_fail();
    }
    __a = __gnu_cxx::
          __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
          operator*((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                     *)in_stack_ffffffffffffff28);
    CVar2 = OutputGetChange(in_stack_ffffffffffffff60,
                            (CTxOut *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
    ;
    local_71[0].field_2._1_8_ = local_71[0].field_2._1_8_ + CVar2;
    bVar1 = MoneyRange((CAmount *)in_stack_ffffffffffffff28);
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      __lhs = local_71;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(in_RSI,__s,(allocator<char> *)__a);
      std::operator+(__lhs,(char *)this);
      std::runtime_error::runtime_error(this,local_28);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00394fb8;
    }
    __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
    operator++((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_> *)
               in_stack_ffffffffffffff28);
  } while( true );
}

Assistant:

CAmount TxGetChange(const CWallet& wallet, const CTransaction& tx)
{
    LOCK(wallet.cs_wallet);
    CAmount nChange = 0;
    for (const CTxOut& txout : tx.vout)
    {
        nChange += OutputGetChange(wallet, txout);
        if (!MoneyRange(nChange))
            throw std::runtime_error(std::string(__func__) + ": value out of range");
    }
    return nChange;
}